

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O3

REF_STATUS ref_recon_l2_projection_grad(REF_GRID ref_grid,REF_DBL *scalar,REF_DBL *grad)

{
  double dVar1;
  int iVar2;
  REF_NODE pRVar3;
  REF_STATUS RVar4;
  uint uVar5;
  uint uVar6;
  void *__s;
  long *plVar7;
  undefined8 *puVar8;
  REF_CELL *ppRVar9;
  long lVar10;
  undefined8 uVar11;
  long lVar12;
  ulong uVar13;
  REF_GRID pRVar14;
  REF_DBL *pRVar15;
  REF_CELL pRVar16;
  char *pcVar17;
  REF_INT RVar18;
  int iVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  REF_DBL cell_vol;
  REF_DBL cell_grad [3];
  REF_BOOL div_by_zero;
  REF_INT qua_nodes [27];
  double local_188;
  REF_NODE local_180;
  REF_DBL *local_178;
  undefined4 local_170;
  REF_INT local_16c;
  REF_DBL local_168 [3];
  undefined4 local_150;
  REF_BOOL local_14c;
  REF_CELL local_148;
  REF_GRID local_140;
  REF_INT local_138 [4];
  REF_INT local_128;
  REF_INT local_cc;
  REF_INT local_c8 [4];
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined8 local_58;
  undefined8 uStack_50;
  REF_CELL *local_40;
  long local_38;
  
  local_180 = ref_grid->node;
  iVar19 = local_180->max;
  lVar12 = (long)iVar19;
  local_178 = scalar;
  local_140 = ref_grid;
  if (lVar12 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x34,
           "ref_recon_l2_projection_grad","malloc vol of REF_DBL negative");
    uVar5 = 1;
  }
  else {
    __s = malloc(lVar12 * 8);
    if (__s == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x34,
             "ref_recon_l2_projection_grad","malloc vol of REF_DBL NULL");
      uVar5 = 2;
    }
    else {
      if (iVar19 != 0) {
        uVar13 = 0;
        memset(__s,0,lVar12 * 8);
        plVar7 = local_180->global;
        do {
          if (-1 < *plVar7) {
            puVar8 = (undefined8 *)((long)grad + (uVar13 & 0x7fffffff8));
            *puVar8 = 0;
            puVar8[1] = 0;
            *(undefined8 *)((long)grad + (uVar13 & 0x7fffffff8) + 0x10) = 0;
          }
          uVar13 = uVar13 + 0x18;
          plVar7 = plVar7 + 1;
        } while (lVar12 * 0x18 != uVar13);
      }
      if (local_140->twod == 0) {
        local_40 = local_140->cell;
        ppRVar9 = local_140->cell + 8;
        lVar12 = 8;
        do {
          pRVar16 = *ppRVar9;
          local_38 = lVar12;
          if (0 < pRVar16->max) {
            RVar18 = 0;
            local_148 = pRVar16;
            do {
              RVar4 = ref_cell_nodes(pRVar16,RVar18,local_c8);
              pRVar3 = local_180;
              if (RVar4 == 0) {
                switch(pRVar16->type) {
                case REF_CELL_EDG:
                case REF_CELL_ED2:
                case REF_CELL_ED3:
                case REF_CELL_TRI:
                case REF_CELL_TR2:
                case REF_CELL_TR3:
                case REF_CELL_QUA:
                case REF_CELL_QU2:
                case REF_CELL_TE2:
                case REF_CELL_PY2:
                case REF_CELL_PR2:
                case REF_CELL_HE2:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x15c,"ref_recon_l2_projection_grad",6,"implement cell type");
                  printf("unknown type %d\n",(ulong)pRVar16->type);
                  return 6;
                case REF_CELL_TET:
                  uVar5 = ref_node_tet_vol(local_180,local_c8,&local_188);
                  uVar6 = ref_node_tet_grad_nodes(pRVar3,local_c8,local_178,local_168);
                  if (uVar5 == 0 && uVar6 == 0) {
                    lVar12 = 0;
                    do {
                      iVar19 = local_c8[lVar12];
                      lVar10 = 0;
                      do {
                        grad[(long)iVar19 * 3 + lVar10] =
                             local_168[lVar10] * local_188 + grad[(long)iVar19 * 3 + lVar10];
                        lVar10 = lVar10 + 1;
                      } while (lVar10 != 3);
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 4);
                    lVar12 = 0;
                    do {
                      *(double *)((long)__s + (long)local_c8[lVar12] * 8) =
                           *(double *)((long)__s + (long)local_c8[lVar12] * 8) + local_188;
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 4);
                  }
                  else {
                    printf("%s: %d: %s: vol status %d grad status %d\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                           ,0x7b,"ref_recon_l2_projection_grad",(ulong)uVar5,(ulong)uVar6);
                  }
                  break;
                case REF_CELL_PYR:
                  local_138[0] = local_c8[0];
                  local_138[1] = uStack_b8;
                  uVar5 = ref_node_tet_vol(local_180,local_138,&local_188);
                  uVar6 = ref_node_tet_grad_nodes(pRVar3,local_138,local_178,local_168);
                  if (uVar5 == 0 && uVar6 == 0) {
                    lVar12 = 0;
                    do {
                      iVar19 = local_138[lVar12];
                      lVar10 = 0;
                      do {
                        grad[(long)iVar19 * 3 + lVar10] =
                             local_168[lVar10] * local_188 + grad[(long)iVar19 * 3 + lVar10];
                        lVar10 = lVar10 + 1;
                      } while (lVar10 != 3);
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 4);
                    lVar12 = 0;
                    do {
                      *(double *)((long)__s + (long)local_138[lVar12] * 8) =
                           *(double *)((long)__s + (long)local_138[lVar12] * 8) + local_188;
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 4);
                  }
                  else {
                    printf("%s: %d: %s: vol status %d grad status %d\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                           ,0xc3,"ref_recon_l2_projection_grad",(ulong)uVar5,(ulong)uVar6);
                  }
                  pRVar3 = local_180;
                  local_138[0] = local_c8[0];
                  local_138[1] = local_c8[3];
                  local_138[2] = uStack_b8;
                  local_138[3] = local_c8[2];
                  uVar5 = ref_node_tet_vol(local_180,local_138,&local_188);
                  uVar6 = ref_node_tet_grad_nodes(pRVar3,local_138,local_178,local_168);
                  if (uVar5 == 0 && uVar6 == 0) {
                    lVar12 = 0;
                    do {
                      iVar19 = local_138[lVar12];
                      lVar10 = 0;
                      do {
                        grad[(long)iVar19 * 3 + lVar10] =
                             local_168[lVar10] * local_188 + grad[(long)iVar19 * 3 + lVar10];
                        lVar10 = lVar10 + 1;
                      } while (lVar10 != 3);
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 4);
                    lVar12 = 0;
                    do {
                      *(double *)((long)__s + (long)local_138[lVar12] * 8) =
                           *(double *)((long)__s + (long)local_138[lVar12] * 8) + local_188;
                      lVar12 = lVar12 + 1;
                      pRVar16 = local_148;
                    } while (lVar12 != 4);
                  }
                  else {
                    uVar11 = 0xd4;
LAB_001aea3f:
                    printf("%s: %d: %s: vol status %d grad status %d\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                           ,uVar11,"ref_recon_l2_projection_grad",(ulong)uVar5,(ulong)uVar6);
                    pRVar16 = local_148;
                  }
                  break;
                case REF_CELL_PRI:
                  local_138[0] = local_c8[0];
                  local_138[3] = local_c8[3];
                  uVar5 = ref_node_tet_vol(local_180,local_138,&local_188);
                  uVar6 = ref_node_tet_grad_nodes(pRVar3,local_138,local_178,local_168);
                  if (uVar5 == 0 && uVar6 == 0) {
                    lVar12 = 0;
                    do {
                      iVar19 = local_138[lVar12];
                      lVar10 = 0;
                      do {
                        grad[(long)iVar19 * 3 + lVar10] =
                             local_168[lVar10] * local_188 + grad[(long)iVar19 * 3 + lVar10];
                        lVar10 = lVar10 + 1;
                      } while (lVar10 != 3);
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 4);
                    lVar12 = 0;
                    do {
                      *(double *)((long)__s + (long)local_138[lVar12] * 8) =
                           *(double *)((long)__s + (long)local_138[lVar12] * 8) + local_188;
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 4);
                  }
                  else {
                    printf("%s: %d: %s: vol status %d grad status %d\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                           ,0x8e,"ref_recon_l2_projection_grad",(ulong)uVar5,(ulong)uVar6);
                  }
                  pRVar3 = local_180;
                  uVar5 = ref_node_tet_vol(local_180,local_138,&local_188);
                  uVar6 = ref_node_tet_grad_nodes(pRVar3,local_138,local_178,local_168);
                  if (uVar5 == 0 && uVar6 == 0) {
                    lVar12 = 0;
                    do {
                      iVar19 = local_138[lVar12];
                      lVar10 = 0;
                      do {
                        grad[(long)iVar19 * 3 + lVar10] =
                             local_168[lVar10] * local_188 + grad[(long)iVar19 * 3 + lVar10];
                        lVar10 = lVar10 + 1;
                      } while (lVar10 != 3);
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 4);
                    lVar12 = 0;
                    do {
                      *(double *)((long)__s + (long)local_138[lVar12] * 8) =
                           *(double *)((long)__s + (long)local_138[lVar12] * 8) + local_188;
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 4);
                  }
                  else {
                    printf("%s: %d: %s: vol status %d grad status %d\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                           ,0x9f,"ref_recon_l2_projection_grad",(ulong)uVar5,(ulong)uVar6);
                  }
                  pRVar3 = local_180;
                  local_138[0] = local_c8[0];
                  local_138[1] = local_c8[1];
                  local_138[2] = local_c8[2];
                  local_138[3] = uStack_b4;
                  uVar5 = ref_node_tet_vol(local_180,local_138,&local_188);
                  uVar6 = ref_node_tet_grad_nodes(pRVar3,local_138,local_178,local_168);
                  if (uVar5 != 0 || uVar6 != 0) {
                    uVar11 = 0xb0;
                    goto LAB_001aea3f;
                  }
                  lVar12 = 0;
                  do {
                    iVar19 = local_138[lVar12];
                    lVar10 = 0;
                    do {
                      grad[(long)iVar19 * 3 + lVar10] =
                           local_168[lVar10] * local_188 + grad[(long)iVar19 * 3 + lVar10];
                      lVar10 = lVar10 + 1;
                    } while (lVar10 != 3);
                    lVar12 = lVar12 + 1;
                  } while (lVar12 != 4);
                  lVar12 = 0;
                  do {
                    *(double *)((long)__s + (long)local_138[lVar12] * 8) =
                         *(double *)((long)__s + (long)local_138[lVar12] * 8) + local_188;
                    lVar12 = lVar12 + 1;
                    pRVar16 = local_148;
                  } while (lVar12 != 4);
                  break;
                case REF_CELL_HEX:
                  local_16c = local_c8[0];
                  local_150 = uStack_b8;
                  local_58 = CONCAT44(local_58._4_4_,local_c8[1]);
                  local_138[0] = local_c8[1];
                  local_cc = local_c8[3];
                  local_138[1] = local_c8[3];
                  local_170 = local_ac;
                  local_138[2] = local_ac;
                  local_138[3] = local_c8[2];
                  uVar5 = ref_node_tet_vol(local_180,local_138,&local_188);
                  uVar6 = ref_node_tet_grad_nodes(pRVar3,local_138,local_178,local_168);
                  if (uVar5 == 0 && uVar6 == 0) {
                    lVar12 = 0;
                    do {
                      iVar19 = local_138[lVar12];
                      lVar10 = 0;
                      do {
                        grad[(long)iVar19 * 3 + lVar10] =
                             local_168[lVar10] * local_188 + grad[(long)iVar19 * 3 + lVar10];
                        lVar10 = lVar10 + 1;
                      } while (lVar10 != 3);
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 4);
                    lVar12 = 0;
                    do {
                      *(double *)((long)__s + (long)local_138[lVar12] * 8) =
                           *(double *)((long)__s + (long)local_138[lVar12] * 8) + local_188;
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 4);
                  }
                  else {
                    printf("%s: %d: %s: vol status %d grad status %d\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                           ,0xef,"ref_recon_l2_projection_grad",(ulong)uVar5,(ulong)uVar6);
                  }
                  pRVar3 = local_180;
                  local_138[0] = (REF_INT)local_58;
                  local_138[1] = local_16c;
                  local_138[2] = local_170;
                  local_138[3] = local_cc;
                  uVar5 = ref_node_tet_vol(local_180,local_138,&local_188);
                  uVar6 = ref_node_tet_grad_nodes(pRVar3,local_138,local_178,local_168);
                  if (uVar5 == 0 && uVar6 == 0) {
                    lVar12 = 0;
                    do {
                      iVar19 = local_138[lVar12];
                      lVar10 = 0;
                      do {
                        grad[(long)iVar19 * 3 + lVar10] =
                             local_168[lVar10] * local_188 + grad[(long)iVar19 * 3 + lVar10];
                        lVar10 = lVar10 + 1;
                      } while (lVar10 != 3);
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 4);
                    lVar12 = 0;
                    do {
                      *(double *)((long)__s + (long)local_138[lVar12] * 8) =
                           *(double *)((long)__s + (long)local_138[lVar12] * 8) + local_188;
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 4);
                  }
                  else {
                    printf("%s: %d: %s: vol status %d grad status %d\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                           ,0x100,"ref_recon_l2_projection_grad",(ulong)uVar5,(ulong)uVar6);
                  }
                  pRVar3 = local_180;
                  local_138[0] = (REF_INT)local_58;
                  local_138[1] = local_16c;
                  local_138[2] = local_150;
                  local_138[3] = local_170;
                  uVar5 = ref_node_tet_vol(local_180,local_138,&local_188);
                  uVar6 = ref_node_tet_grad_nodes(pRVar3,local_138,local_178,local_168);
                  if (uVar5 == 0 && uVar6 == 0) {
                    lVar12 = 0;
                    do {
                      iVar19 = local_138[lVar12];
                      lVar10 = 0;
                      do {
                        grad[(long)iVar19 * 3 + lVar10] =
                             local_168[lVar10] * local_188 + grad[(long)iVar19 * 3 + lVar10];
                        lVar10 = lVar10 + 1;
                      } while (lVar10 != 3);
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 4);
                    lVar12 = 0;
                    do {
                      *(double *)((long)__s + (long)local_138[lVar12] * 8) =
                           *(double *)((long)__s + (long)local_138[lVar12] * 8) + local_188;
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 4);
                  }
                  else {
                    printf("%s: %d: %s: vol status %d grad status %d\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                           ,0x111,"ref_recon_l2_projection_grad",(ulong)uVar5,(ulong)uVar6);
                  }
                  pRVar3 = local_180;
                  local_16c = local_c8[1];
                  local_58 = CONCAT44(uStack_b4,uStack_b8);
                  uStack_50 = 0;
                  local_150 = local_ac;
                  local_138[1] = local_ac;
                  local_170 = local_b0;
                  local_138[2] = local_b0;
                  local_138[3] = local_c8[2];
                  uVar5 = ref_node_tet_vol(local_180,local_138,&local_188);
                  uVar6 = ref_node_tet_grad_nodes(pRVar3,local_138,local_178,local_168);
                  if (uVar5 == 0 && uVar6 == 0) {
                    lVar12 = 0;
                    do {
                      iVar19 = local_138[lVar12];
                      lVar10 = 0;
                      do {
                        grad[(long)iVar19 * 3 + lVar10] =
                             local_168[lVar10] * local_188 + grad[(long)iVar19 * 3 + lVar10];
                        lVar10 = lVar10 + 1;
                      } while (lVar10 != 3);
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 4);
                    lVar12 = 0;
                    do {
                      *(double *)((long)__s + (long)local_138[lVar12] * 8) =
                           *(double *)((long)__s + (long)local_138[lVar12] * 8) + local_188;
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 4);
                  }
                  else {
                    printf("%s: %d: %s: vol status %d grad status %d\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                           ,0x129,"ref_recon_l2_projection_grad",(ulong)uVar5,(ulong)uVar6);
                  }
                  pRVar3 = local_180;
                  local_138[0] = local_16c;
                  local_138[1] = (REF_INT)local_58;
                  local_138[2] = local_170;
                  local_138[3] = local_150;
                  uVar5 = ref_node_tet_vol(local_180,local_138,&local_188);
                  uVar6 = ref_node_tet_grad_nodes(pRVar3,local_138,local_178,local_168);
                  if (uVar5 == 0 && uVar6 == 0) {
                    lVar12 = 0;
                    do {
                      iVar19 = local_138[lVar12];
                      lVar10 = 0;
                      do {
                        grad[(long)iVar19 * 3 + lVar10] =
                             local_168[lVar10] * local_188 + grad[(long)iVar19 * 3 + lVar10];
                        lVar10 = lVar10 + 1;
                      } while (lVar10 != 3);
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 4);
                    lVar12 = 0;
                    do {
                      *(double *)((long)__s + (long)local_138[lVar12] * 8) =
                           *(double *)((long)__s + (long)local_138[lVar12] * 8) + local_188;
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != 4);
                  }
                  else {
                    printf("%s: %d: %s: vol status %d grad status %d\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                           ,0x13a,"ref_recon_l2_projection_grad",(ulong)uVar5,(ulong)uVar6);
                  }
                  pRVar3 = local_180;
                  local_138[0] = local_16c;
                  local_138[1] = (REF_INT)local_58;
                  local_138[2] = (REF_INT)((ulong)local_58 >> 0x20);
                  local_138[3] = local_170;
                  uVar5 = ref_node_tet_vol(local_180,local_138,&local_188);
                  uVar6 = ref_node_tet_grad_nodes(pRVar3,local_138,local_178,local_168);
                  if (uVar5 != 0 || uVar6 != 0) {
                    uVar11 = 0x14b;
                    goto LAB_001aea3f;
                  }
                  lVar12 = 0;
                  do {
                    iVar19 = local_138[lVar12];
                    lVar10 = 0;
                    do {
                      grad[(long)iVar19 * 3 + lVar10] =
                           local_168[lVar10] * local_188 + grad[(long)iVar19 * 3 + lVar10];
                      lVar10 = lVar10 + 1;
                    } while (lVar10 != 3);
                    lVar12 = lVar12 + 1;
                  } while (lVar12 != 4);
                  lVar12 = 0;
                  do {
                    *(double *)((long)__s + (long)local_138[lVar12] * 8) =
                         *(double *)((long)__s + (long)local_138[lVar12] * 8) + local_188;
                    lVar12 = lVar12 + 1;
                    pRVar16 = local_148;
                  } while (lVar12 != 4);
                }
              }
              RVar18 = RVar18 + 1;
            } while (RVar18 < pRVar16->max);
          }
          ppRVar9 = local_40 + local_38 + 1;
          lVar12 = local_38 + 1;
        } while (lVar12 != 0x10);
      }
      else {
        pRVar16 = local_140->cell[3];
        pRVar14 = local_140;
        if (0 < pRVar16->max) {
          iVar19 = 0;
          do {
            RVar4 = ref_cell_nodes(pRVar16,iVar19,local_c8);
            pRVar3 = local_180;
            if (RVar4 == 0) {
              uVar5 = ref_node_tri_area(local_180,local_c8,&local_188);
              uVar6 = ref_node_tri_grad_nodes(pRVar3,local_c8,local_178,local_168);
              if (uVar5 == 0 && uVar6 == 0) {
                lVar12 = 0;
                do {
                  iVar2 = local_c8[lVar12];
                  lVar10 = 0;
                  do {
                    grad[(long)iVar2 * 3 + lVar10] =
                         local_168[lVar10] * local_188 + grad[(long)iVar2 * 3 + lVar10];
                    lVar10 = lVar10 + 1;
                  } while (lVar10 != 3);
                  lVar12 = lVar12 + 1;
                } while (lVar12 != 3);
                lVar12 = 0;
                do {
                  *(double *)((long)__s + (long)local_c8[lVar12] * 8) =
                       *(double *)((long)__s + (long)local_c8[lVar12] * 8) + local_188;
                  lVar12 = lVar12 + 1;
                  pRVar14 = local_140;
                } while (lVar12 != 3);
              }
              else {
                printf("%s: %d: %s: vol status %d grad status %d\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x44,"ref_recon_l2_projection_grad",(ulong)uVar5,(ulong)uVar6);
                pRVar14 = local_140;
              }
            }
            iVar19 = iVar19 + 1;
            pRVar16 = pRVar14->cell[3];
          } while (iVar19 < pRVar16->max);
        }
        pRVar16 = pRVar14->cell[6];
        if (0 < pRVar16->max) {
          RVar18 = 0;
          do {
            RVar4 = ref_cell_nodes(pRVar16,RVar18,local_138);
            pRVar3 = local_180;
            if (RVar4 == 0) {
              local_c8[2] = local_138[2];
              local_c8[3] = local_128;
              uVar5 = ref_node_tri_area(local_180,local_c8,&local_188);
              uVar6 = ref_node_tri_grad_nodes(pRVar3,local_c8,local_178,local_168);
              if (uVar5 == 0 && uVar6 == 0) {
                lVar12 = 0;
                do {
                  iVar19 = local_c8[lVar12];
                  lVar10 = 0;
                  do {
                    grad[(long)iVar19 * 3 + lVar10] =
                         local_168[lVar10] * local_188 + grad[(long)iVar19 * 3 + lVar10];
                    lVar10 = lVar10 + 1;
                  } while (lVar10 != 3);
                  lVar12 = lVar12 + 1;
                } while (lVar12 != 3);
                lVar12 = 0;
                do {
                  *(double *)((long)__s + (long)local_c8[lVar12] * 8) =
                       *(double *)((long)__s + (long)local_c8[lVar12] * 8) + local_188;
                  lVar12 = lVar12 + 1;
                } while (lVar12 != 3);
              }
              else {
                printf("%s: %d: %s: vol status %d grad status %d\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x57,"ref_recon_l2_projection_grad",(ulong)uVar5,(ulong)uVar6);
              }
              pRVar3 = local_180;
              local_c8[0] = local_138[0];
              local_c8[3] = local_128;
              uVar5 = ref_node_tri_area(local_180,local_c8,&local_188);
              uVar6 = ref_node_tri_grad_nodes(pRVar3,local_c8,local_178,local_168);
              if (uVar5 == 0 && uVar6 == 0) {
                lVar12 = 0;
                do {
                  iVar19 = local_c8[lVar12];
                  lVar10 = 0;
                  do {
                    grad[(long)iVar19 * 3 + lVar10] =
                         local_168[lVar10] * local_188 + grad[(long)iVar19 * 3 + lVar10];
                    lVar10 = lVar10 + 1;
                  } while (lVar10 != 3);
                  lVar12 = lVar12 + 1;
                } while (lVar12 != 3);
                lVar12 = 0;
                do {
                  *(double *)((long)__s + (long)local_c8[lVar12] * 8) =
                       *(double *)((long)__s + (long)local_c8[lVar12] * 8) + local_188;
                  lVar12 = lVar12 + 1;
                  pRVar14 = local_140;
                } while (lVar12 != 3);
              }
              else {
                printf("%s: %d: %s: vol status %d grad status %d\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x67,"ref_recon_l2_projection_grad",(ulong)uVar5,(ulong)uVar6);
                pRVar14 = local_140;
              }
            }
            RVar18 = RVar18 + 1;
            pRVar16 = pRVar14->cell[6];
          } while (RVar18 < pRVar16->max);
        }
      }
      local_14c = 0;
      iVar19 = local_180->max;
      if (0 < iVar19) {
        lVar12 = 0;
        pRVar15 = grad;
        do {
          if (-1 < local_180->global[lVar12]) {
            dVar1 = *(double *)((long)__s + lVar12 * 8);
            auVar21._0_8_ = dVar1 * 1e+20;
            auVar21._8_8_ = grad[lVar12 * 3];
            auVar22._8_8_ = -grad[lVar12 * 3];
            auVar22._0_8_ = -auVar21._0_8_;
            auVar22 = maxpd(auVar21,auVar22);
            dVar20 = auVar22._0_8_;
            if (auVar22._8_8_ < dVar20) {
              dVar23 = grad[lVar12 * 3 + 1];
              if (dVar23 <= -dVar23) {
                dVar23 = -dVar23;
              }
              if (dVar23 < dVar20) {
                dVar23 = grad[lVar12 * 3 + 2];
                if (dVar23 <= -dVar23) {
                  dVar23 = -dVar23;
                }
                if (dVar23 < dVar20) {
                  lVar10 = 0;
                  do {
                    pRVar15[lVar10] = pRVar15[lVar10] / dVar1;
                    lVar10 = lVar10 + 1;
                  } while (lVar10 != 3);
                  goto LAB_001ade6e;
                }
              }
            }
            puVar8 = (undefined8 *)((lVar12 * 0x18 & 0x7fffffff8U) + (long)grad);
            local_14c = 1;
            *puVar8 = 0;
            puVar8[1] = 0;
            puVar8[2] = 0;
            printf("%s: %d: %s: total vol %e, ignored\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x16b,"ref_recon_l2_projection_grad");
            iVar19 = local_180->max;
          }
LAB_001ade6e:
          lVar12 = lVar12 + 1;
          pRVar15 = pRVar15 + 3;
        } while (lVar12 < iVar19);
      }
      uVar5 = ref_mpi_all_or(local_140->mpi,&local_14c);
      if (uVar5 == 0) {
        uVar5 = ref_node_ghost_dbl(local_180,grad,3);
        if (uVar5 == 0) {
          free(__s);
          return (uint)(local_14c != 0) << 2;
        }
        pcVar17 = "update ghosts";
        uVar11 = 0x170;
      }
      else {
        pcVar17 = "mpi all or";
        uVar11 = 0x16f;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
             uVar11,"ref_recon_l2_projection_grad",(ulong)uVar5,pcVar17);
    }
  }
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_recon_l2_projection_grad(REF_GRID ref_grid,
                                                REF_DBL *scalar,
                                                REF_DBL *grad) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT i, node, cell, group, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER], tet_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT pri_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT qua_nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL div_by_zero;
  REF_DBL cell_vol, cell_grad[3];
  REF_DBL *vol;
  REF_STATUS vol_status, grad_status;

  ref_malloc_init(vol, ref_node_max(ref_node), REF_DBL, 0.0);

  each_ref_node_valid_node(ref_node, node) for (i = 0; i < 3; i++)
      grad[i + 3 * node] = 0.0;

  if (ref_grid_twod(ref_grid)) {
    each_ref_cell_valid_cell_with_nodes(ref_grid_tri(ref_grid), cell, nodes) {
      vol_status = ref_node_tri_area(ref_node, nodes, &cell_vol);
      grad_status = ref_node_tri_grad_nodes(ref_node, nodes, scalar, cell_grad);
      if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
        for (cell_node = 0; cell_node < 3; cell_node++)
          for (i = 0; i < 3; i++)
            grad[i + 3 * nodes[cell_node]] += cell_vol * cell_grad[i];
        for (cell_node = 0; cell_node < 3; cell_node++)
          vol[nodes[cell_node]] += cell_vol;
      } else {
        printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__, __LINE__,
               __func__, vol_status, grad_status);
      }
    }
    each_ref_cell_valid_cell_with_nodes(ref_grid_qua(ref_grid), cell,
                                        qua_nodes) {
      nodes[0] = qua_nodes[0];
      nodes[1] = qua_nodes[1];
      nodes[2] = qua_nodes[2];
      nodes[3] = qua_nodes[4];
      vol_status = ref_node_tri_area(ref_node, nodes, &cell_vol);
      grad_status = ref_node_tri_grad_nodes(ref_node, nodes, scalar, cell_grad);
      if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
        for (cell_node = 0; cell_node < 3; cell_node++)
          for (i = 0; i < 3; i++)
            grad[i + 3 * nodes[cell_node]] += cell_vol * cell_grad[i];
        for (cell_node = 0; cell_node < 3; cell_node++)
          vol[nodes[cell_node]] += cell_vol;
      } else {
        printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__, __LINE__,
               __func__, vol_status, grad_status);
      }
      nodes[0] = qua_nodes[0];
      nodes[1] = qua_nodes[2];
      nodes[2] = qua_nodes[3];
      nodes[3] = qua_nodes[4];
      vol_status = ref_node_tri_area(ref_node, nodes, &cell_vol);
      grad_status = ref_node_tri_grad_nodes(ref_node, nodes, scalar, cell_grad);
      if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
        for (cell_node = 0; cell_node < 3; cell_node++)
          for (i = 0; i < 3; i++)
            grad[i + 3 * nodes[cell_node]] += cell_vol * cell_grad[i];
        for (cell_node = 0; cell_node < 3; cell_node++)
          vol[nodes[cell_node]] += cell_vol;
      } else {
        printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__, __LINE__,
               __func__, vol_status, grad_status);
      }
    }
  } else {
    each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        switch (ref_cell_type(ref_cell)) {
          case REF_CELL_TET:
            vol_status = ref_node_tet_vol(ref_node, nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            break;
          case REF_CELL_PRI:
            tet_nodes[0] = nodes[0];
            tet_nodes[1] = nodes[4];
            tet_nodes[2] = nodes[5];
            tet_nodes[3] = nodes[3];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            tet_nodes[0] = nodes[0];
            tet_nodes[1] = nodes[1];
            tet_nodes[2] = nodes[5];
            tet_nodes[3] = nodes[4];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            tet_nodes[0] = nodes[0];
            tet_nodes[1] = nodes[1];
            tet_nodes[2] = nodes[2];
            tet_nodes[3] = nodes[5];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            break;
          case REF_CELL_PYR:
            tet_nodes[0] = nodes[0];
            tet_nodes[1] = nodes[4];
            tet_nodes[2] = nodes[1];
            tet_nodes[3] = nodes[2];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            tet_nodes[0] = nodes[0];
            tet_nodes[1] = nodes[3];
            tet_nodes[2] = nodes[4];
            tet_nodes[3] = nodes[2];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            break;
          case REF_CELL_HEX:

            pri_nodes[0] = nodes[1];
            pri_nodes[1] = nodes[0];
            pri_nodes[2] = nodes[4];
            pri_nodes[3] = nodes[2];
            pri_nodes[4] = nodes[3];
            pri_nodes[5] = nodes[7];

            tet_nodes[0] = pri_nodes[0];
            tet_nodes[1] = pri_nodes[4];
            tet_nodes[2] = pri_nodes[5];
            tet_nodes[3] = pri_nodes[3];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            tet_nodes[0] = pri_nodes[0];
            tet_nodes[1] = pri_nodes[1];
            tet_nodes[2] = pri_nodes[5];
            tet_nodes[3] = pri_nodes[4];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            tet_nodes[0] = pri_nodes[0];
            tet_nodes[1] = pri_nodes[1];
            tet_nodes[2] = pri_nodes[2];
            tet_nodes[3] = pri_nodes[5];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }

            pri_nodes[0] = nodes[1];
            pri_nodes[1] = nodes[4];
            pri_nodes[2] = nodes[5];
            pri_nodes[3] = nodes[2];
            pri_nodes[4] = nodes[7];
            pri_nodes[5] = nodes[6];

            tet_nodes[1] = pri_nodes[4];
            tet_nodes[2] = pri_nodes[5];
            tet_nodes[3] = pri_nodes[3];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            tet_nodes[0] = pri_nodes[0];
            tet_nodes[1] = pri_nodes[1];
            tet_nodes[2] = pri_nodes[5];
            tet_nodes[3] = pri_nodes[4];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            tet_nodes[0] = pri_nodes[0];
            tet_nodes[1] = pri_nodes[1];
            tet_nodes[2] = pri_nodes[2];
            tet_nodes[3] = pri_nodes[5];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }

            break;
          case REF_CELL_EDG:
          case REF_CELL_ED2:
          case REF_CELL_ED3:
          case REF_CELL_TRI:
          case REF_CELL_TR2:
          case REF_CELL_TR3:
          case REF_CELL_QUA:
          case REF_CELL_QU2:
          case REF_CELL_TE2:
          case REF_CELL_PY2:
          case REF_CELL_PR2:
          case REF_CELL_HE2:
            RSB(REF_IMPLEMENT, "implement cell type",
                { printf("unknown type %d\n", (int)ref_cell_type(ref_cell)); });
        }
      }
    }
  }

  div_by_zero = REF_FALSE;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_math_divisible(grad[0 + 3 * node], vol[node]) &&
        ref_math_divisible(grad[1 + 3 * node], vol[node]) &&
        ref_math_divisible(grad[2 + 3 * node], vol[node])) {
      for (i = 0; i < 3; i++) grad[i + 3 * node] /= vol[node];
    } else {
      div_by_zero = REF_TRUE;
      for (i = 0; i < 3; i++) grad[i + 3 * node] = 0.0;
      printf("%s: %d: %s: total vol %e, ignored\n", __FILE__, __LINE__,
             __func__, vol[node]);
    }
  }
  RSS(ref_mpi_all_or(ref_grid_mpi(ref_grid), &div_by_zero), "mpi all or");
  RSS(ref_node_ghost_dbl(ref_node, grad, 3), "update ghosts");

  ref_free(vol);

  return (div_by_zero ? REF_DIV_ZERO : REF_SUCCESS);
}